

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

buffered_file open_buffered_file(FILE **fp)

{
  FILE *pFVar1;
  size_t in_RCX;
  int __fd;
  undefined8 *in_RSI;
  FILE *in_RDI;
  file write_end;
  file read_end;
  buffered_file *f;
  file *this;
  file local_18;
  file local_14;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  fmt::v5::file::file(&local_14);
  this = &local_18;
  fmt::v5::file::file(this);
  fmt::v5::file::pipe(&local_14,&this->fd_);
  __fd = 0x1962b5;
  fmt::v5::file::write(&local_18,0x1962b5,(void *)0xc,in_RCX);
  fmt::v5::file::close(&local_18,__fd);
  fmt::v5::file::fdopen((file *)in_RDI,(int)&local_14,"r");
  if (local_10 != (undefined8 *)0x0) {
    pFVar1 = fmt::v5::buffered_file::get((buffered_file *)in_RDI);
    *local_10 = pFVar1;
  }
  fmt::v5::file::~file(this);
  fmt::v5::file::~file(this);
  return (buffered_file)in_RDI;
}

Assistant:

fmt::buffered_file open_buffered_file(FILE **fp) {
  fmt::file read_end, write_end;
  fmt::file::pipe(read_end, write_end);
  write_end.write(FILE_CONTENT, std::strlen(FILE_CONTENT));
  write_end.close();
  fmt::buffered_file f = read_end.fdopen("r");
  if (fp)
    *fp = f.get();
  return f;
}